

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

int anon_unknown.dwarf_f56f6::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  plVar3 = (anonymous_namespace)::MyItem::s_current_sort_specs;
  uVar5 = (ulong)*(uint *)((anonymous_namespace)::MyItem::s_current_sort_specs + 1);
  if ((int)*(uint *)((anonymous_namespace)::MyItem::s_current_sort_specs + 1) < 1) {
    uVar5 = 0;
  }
  uVar6 = 0;
  while( true ) {
    uVar1 = uVar6 + 0xc;
    if (uVar5 * 0xc + 0xc == uVar1) {
      return *lhs - *rhs;
    }
    lVar2 = *plVar3;
    switch(*(undefined4 *)(lVar2 + uVar6)) {
    case 0:
      iVar4 = *lhs - *rhs;
      break;
    case 1:
    case 4:
      iVar4 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                    ,0xde0,
                    "static int (anonymous namespace)::MyItem::CompareWithSortSpecs(const void *, const void *)"
                   );
    case 3:
      iVar4 = *(int *)((long)lhs + 0x10) - *(int *)((long)rhs + 0x10);
    }
    if (0 < iVar4) break;
    uVar6 = uVar1;
    if (iVar4 < 0) {
      bVar7 = *(char *)(lVar2 + -4 + uVar1) != '\x01';
LAB_001ab895:
      return (uint)bVar7 * 2 + -1;
    }
  }
  bVar7 = *(char *)(lVar2 + 8 + uVar6) == '\x01';
  goto LAB_001ab895;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }